

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::type_caster<char,_void>::cast
                 (char *src,return_value_policy policy,handle parent)

{
  handle *phVar1;
  handle in_RDX;
  long in_RDI;
  handle *in_stack_ffffffffffffff70;
  none *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  return_value_policy rVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  PyObject *local_8;
  
  rVar2 = (return_value_policy)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  if (in_RDI == 0) {
    none::none(in_stack_ffffffffffffff80);
    phVar1 = pybind11::handle::inc_ref(in_stack_ffffffffffffff70);
    local_8 = phVar1->m_ptr;
    none::~none((none *)0x166373);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_8 = (PyObject *)
              string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::cast(in_stack_ffffffffffffff90,rVar2,in_RDX);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  }
  return (handle)local_8;
}

Assistant:

static handle cast(const CharT *src, return_value_policy policy, handle parent) {
        if (src == nullptr) return pybind11::none().inc_ref();
        return StringCaster::cast(StringType(src), policy, parent);
    }